

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

void __thiscall
cxxopts::values::abstract_value<unsigned_int>::abstract_value
          (abstract_value<unsigned_int> *this,abstract_value<unsigned_int> *rhs)

{
  shared_ptr<unsigned_int> *this_00;
  __shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  (this->super_Value).super_enable_shared_from_this<cxxopts::Value>._M_weak_this.
  super___weak_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_Value).super_enable_shared_from_this<cxxopts::Value>._M_weak_this.
  super___weak_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Value)._vptr_Value = (_func_int **)&PTR__abstract_value_0013fa28;
  (this->m_result).super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_result).super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)
   ((long)&(this->m_result).super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi + 2) = 0;
  *(undefined8 *)((long)&this->m_store + 2) = 0;
  (this->m_default_value)._M_dataplus._M_p = (pointer)&(this->m_default_value).field_2;
  (this->m_default_value)._M_string_length = 0;
  (this->m_default_value).field_2._M_local_buf[0] = '\0';
  (this->m_implicit_value)._M_dataplus._M_p = (pointer)&(this->m_implicit_value).field_2;
  (this->m_implicit_value)._M_string_length = 0;
  (this->m_implicit_value).field_2._M_local_buf[0] = '\0';
  if ((rhs->m_result).super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    this_00 = (shared_ptr<unsigned_int> *)&rhs->m_store;
  }
  else {
    std::make_shared<unsigned_int>();
    this_00 = &this->m_result;
    std::__shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&this_00->super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>,&_Stack_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  }
  this->m_store = (this_00->super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this->m_default = rhs->m_default;
  this->m_implicit = rhs->m_implicit;
  std::__cxx11::string::_M_assign((string *)&this->m_default_value);
  std::__cxx11::string::_M_assign((string *)&this->m_implicit_value);
  return;
}

Assistant:

abstract_value(const abstract_value& rhs)
      {
        if (rhs.m_result)
        {
          m_result = std::make_shared<T>();
          m_store = m_result.get();
        }
        else
        {
          m_store = rhs.m_store;
        }

        m_default = rhs.m_default;
        m_implicit = rhs.m_implicit;
        m_default_value = rhs.m_default_value;
        m_implicit_value = rhs.m_implicit_value;
      }